

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ppu.c
# Opt level: O1

void ppu_handle_lyc(gb_ppu_t *ppu)

{
  byte bVar1;
  
  bVar1 = ppu->reg_stat;
  if (ppu->reg_ly == ppu->reg_lyc) {
    ppu->reg_stat = bVar1 | 4;
    if (((bVar1 & 0x40) != 0) && (ppu->lcdc_blocked == false)) {
      int_request(&ppu->gb->intr_ctrl,INT_LCDC);
      ppu->lcdc_blocked = true;
    }
  }
  else {
    ppu->reg_stat = bVar1 & 0xfb;
  }
  return;
}

Assistant:

static void ppu_handle_lyc(gb_ppu_t *ppu)
{
    if (ppu->reg_ly == ppu->reg_lyc)
    {
        SET_BIT(ppu->reg_stat, STAT_LYC_FLAG_BIT, 1);

        if (GET_BIT(ppu->reg_stat, STAT_LYC_INT_BIT) && !ppu->lcdc_blocked)
        {
            int_request(&ppu->gb->intr_ctrl, INT_LCDC);
            ppu->lcdc_blocked = true;
        }
    }
    else
        SET_BIT(ppu->reg_stat, STAT_LYC_FLAG_BIT, 0);
}